

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetRepaintManager::flush
          (QWidgetRepaintManager *this,QWidget *widget,QRegion *region,
          QPlatformTextureList *widgetTextures)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  QWindow *pQVar4;
  long lVar5;
  QWidgetPrivate *pQVar6;
  QDebug *pQVar7;
  long *plVar8;
  Type *in_RCX;
  QWindow *in_RDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  FlushResult flushResult;
  bool translucentBackground;
  QWidgetPrivate *widgetPrivate;
  bool flushWithRhi;
  double fps;
  QWindow *window;
  QPoint offset;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QWidget *in_stack_fffffffffffffed8;
  QWidget *in_stack_fffffffffffffee0;
  WidgetAttribute attribute;
  QWidget *in_stack_fffffffffffffee8;
  QWidget *in_stack_fffffffffffffef0;
  QWidget *in_stack_fffffffffffffef8;
  QWidget *in_stack_ffffffffffffff00;
  Type eventType;
  char *in_stack_ffffffffffffff28;
  Type *local_c8;
  QWidget *in_stack_ffffffffffffff58;
  QDebug *in_stack_ffffffffffffff60;
  QDebug local_88;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58 [2];
  QPoint local_48;
  undefined1 *local_40;
  char local_38 [32];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWidget::testAttribute
                    (in_stack_fffffffffffffee8,
                     (WidgetAttribute)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  if ((!bVar2) &&
     (bVar2 = QWidget::testAttribute
                        (in_stack_fffffffffffffee8,
                         (WidgetAttribute)((ulong)in_stack_fffffffffffffee0 >> 0x20)), !bVar2)) {
    pQVar4 = QWidget::windowHandle(in_stack_fffffffffffffee0);
    iVar3 = QWindow::type();
    if (iVar3 != 0x21) {
      if ((flush(QWidget*,QRegion_const&,QPlatformTextureList*)::fpsDebug == '\0') &&
         (iVar3 = __cxa_guard_acquire(&flush(QWidget*,QRegion_const&,QPlatformTextureList*)::
                                       fpsDebug), iVar3 != 0)) {
        iVar3 = qEnvironmentVariableIntValue("QT_DEBUG_FPS",(bool *)0x0);
        flush::fpsDebug = iVar3 != 0;
        __cxa_guard_release(&flush(QWidget*,QRegion_const&,QPlatformTextureList*)::fpsDebug);
      }
      if ((flush::fpsDebug & 1U) != 0) {
        iVar3 = *(int *)(in_RDI + 4);
        *(int *)(in_RDI + 4) = iVar3 + 1;
        if (iVar3 == 0) {
          QElapsedTimer::start();
        }
        lVar5 = QElapsedTimer::elapsed();
        if (5000 < lVar5) {
          in_stack_ffffffffffffff00 = (QWidget *)(double)(*(int *)(in_RDI + 4) * 1000);
          lVar5 = QElapsedTimer::restart();
          in_stack_ffffffffffffff28 = (char *)((double)in_stack_ffffffffffffff00 / (double)lVar5);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                     (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                     (char *)in_stack_fffffffffffffed8);
          QMessageLogger::debug(local_38,in_stack_ffffffffffffff28,"FPS: %.1f\n");
          *(undefined4 *)(in_RDI + 4) = 0;
        }
      }
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffee0);
      if (in_RSI != *(QWidget **)in_RDI) {
        in_stack_fffffffffffffef8 = *(QWidget **)in_RDI;
        QPoint::QPoint((QPoint *)in_stack_fffffffffffffee0);
        local_48 = QWidget::mapTo(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                                  (QPoint *)in_RSI);
        QPoint::operator+=((QPoint *)in_stack_fffffffffffffee0,(QPoint *)in_stack_fffffffffffffed8);
        in_stack_fffffffffffffef0 = in_RSI;
      }
      pQVar6 = QWidget::d_func((QWidget *)0x3a71f8);
      uVar1 = *(uint *)&pQVar6->field_0x250;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcWidgetPainting();
      anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffee0,
                 (QLoggingCategory *)in_stack_fffffffffffffed8);
      while( true ) {
        bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_18);
        eventType = (Type)((ulong)in_stack_ffffffffffffff00 >> 0x20);
        attribute = (WidgetAttribute)((ulong)in_stack_fffffffffffffee0 >> 0x20);
        if (!bVar2) break;
        anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3a7266);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,
                   (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(char *)in_stack_fffffffffffffed8
                   ,(char *)0x3a727f);
        QMessageLogger::debug();
        pQVar7 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
        QDebug::QDebug(&local_80,pQVar7);
        ::operator<<((QDebug *)&local_78,(QRegion *)&local_80);
        pQVar7 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
        QDebug::QDebug(&local_70,pQVar7);
        ::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        pQVar7 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
        QDebug::QDebug(&local_60,pQVar7);
        ::operator<<((QDebug *)local_58,(QWindow *)&local_60);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff28);
        QDebug::~QDebug(local_58);
        QDebug::~QDebug(&local_60);
        QDebug::~QDebug(&local_68);
        QDebug::~QDebug(&local_70);
        QDebug::~QDebug(&local_78);
        QDebug::~QDebug(&local_80);
        QDebug::~QDebug(&local_88);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
      if ((uVar1 >> 0x1c & 1) == 0) {
        QBackingStore::flush(*(QRegion **)&in_RDI->field_0x8,in_RDX,(QPoint *)pQVar4);
      }
      else {
        local_c8 = in_RCX;
        if (in_RCX == (Type *)0x0) {
          local_c8 = QGlobalStatic::operator_cast_to_QPlatformTextureList_
                               ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>_>
                                 *)in_stack_fffffffffffffed8);
        }
        QWidgetPrivate::get((QWidget *)0x3a740a);
        QWidgetPrivate::sendComposeStatus
                  (in_stack_fffffffffffffef0,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
        bVar2 = QWidget::testAttribute(in_stack_fffffffffffffee8,attribute);
        plVar8 = (long *)QBackingStore::handle();
        QPaintDevice::devicePixelRatio();
        iVar3 = (**(code **)(*plVar8 + 0x20))(plVar8,pQVar4,in_RDX,&local_40,local_c8,bVar2);
        QWidgetPrivate::sendComposeStatus(in_stack_fffffffffffffef0,SUB81((ulong)pQVar4 >> 0x38,0));
        if (iVar3 == 2) {
          QWidget::window(in_stack_fffffffffffffef0);
          qSendWindowChangeToTextureChildrenRecursively(in_RDI,eventType);
          pQVar4 = (QWindow *)QBackingStore::handle();
          QPlatformBackingStore::graphicsDeviceReportedLost(pQVar4);
          QWidget::window(in_stack_fffffffffffffef0);
          qSendWindowChangeToTextureChildrenRecursively(in_RDI,eventType);
          QWidget::update(in_stack_fffffffffffffed8);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::flush(QWidget *widget, const QRegion &region, QPlatformTextureList *widgetTextures)
{
    Q_ASSERT(!region.isEmpty() || widgetTextures);
    Q_ASSERT(widget);
    Q_ASSERT(tlw);

    if (tlw->testAttribute(Qt::WA_DontShowOnScreen) || widget->testAttribute(Qt::WA_DontShowOnScreen))
        return;

    QWindow *window = widget->windowHandle();
    // We should only be flushing to native widgets
    Q_ASSERT(window);

    // Foreign Windows do not have backing store content and must not be flushed
    if (window->type() == Qt::ForeignWindow)
        return;

    static bool fpsDebug = qEnvironmentVariableIntValue("QT_DEBUG_FPS");
    if (fpsDebug) {
        if (!perfFrames++)
            perfTime.start();
        if (perfTime.elapsed() > 5000) {
            double fps = double(perfFrames * 1000) / perfTime.restart();
            qDebug("FPS: %.1f\n", fps);
            perfFrames = 0;
        }
    }

    QPoint offset;
    if (widget != tlw)
        offset += widget->mapTo(tlw, QPoint());

    // A widget uses RHI flush if itself, or one of its non-native children
    // uses RHI for its drawing. If so, we composite the backing store raster
    // data along with textures produced by the RHI widgets.
    const bool flushWithRhi = widget->d_func()->usesRhiFlush;

    qCDebug(lcWidgetPainting) << "Flushing" << region << "of" << widget
        << "to" << window << (flushWithRhi ? "using RHI" : "");

    // A widget uses RHI flush if itself, or one of its non-native children
    // uses RHI for its drawing. If so, we composite the backing store raster
    // data along with textures produced by the RHI widgets.
    if (flushWithRhi) {
        if (!widgetTextures)
            widgetTextures = qt_dummy_platformTextureList;

        // We only need to let the widget sub-hierarchy that
        // we are flushing know that we're compositing.
        auto *widgetPrivate = QWidgetPrivate::get(widget);
        widgetPrivate->sendComposeStatus(widget, false);

        // A window may have alpha even when the app did not request
        // WA_TranslucentBackground. Therefore the compositor needs to know whether the app intends
        // to rely on translucency, in order to decide if it should clear to transparent or opaque.
        const bool translucentBackground = widget->testAttribute(Qt::WA_TranslucentBackground);

        QPlatformBackingStore::FlushResult flushResult;
        flushResult = store->handle()->rhiFlush(window,
                                                widget->devicePixelRatio(),
                                                region,
                                                offset,
                                                widgetTextures,
                                                translucentBackground);

        widgetPrivate->sendComposeStatus(widget, true);

        if (flushResult == QPlatformBackingStore::FlushFailedDueToLostDevice) {
            qSendWindowChangeToTextureChildrenRecursively(widget->window(),
                                                          QEvent::WindowAboutToChangeInternal);
            store->handle()->graphicsDeviceReportedLost(window);
            qSendWindowChangeToTextureChildrenRecursively(widget->window(),
                                                          QEvent::WindowChangeInternal);
            widget->update();
        }
    } else {
        store->flush(region, window, offset);
    }
}